

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O3

void * allocmem(memory *m,int elemsize)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t __size;
  
  if (m->current < m->last) {
    pvVar3 = (void *)((long)m->current + (long)elemsize);
    m->current = pvVar3;
  }
  else {
    iVar1 = m->nr;
    m->nr = iVar1 + 1;
    if ((long)iVar1 < 99) {
      iVar2 = m->allocnr;
      if (iVar1 < iVar2) {
        pvVar3 = m->block[(long)iVar1 + 1];
        __size = (size_t)m->blocksize;
      }
      else {
        __size = (size_t)m->blocksize;
        pvVar3 = malloc(__size);
        m->block[iVar1 + 1] = pvVar3;
        m->allocnr = iVar2 + 1;
      }
      m->first = pvVar3;
      m->current = pvVar3;
      m->last = (void *)((long)pvVar3 + (__size - (long)elemsize));
    }
    else {
      pvVar3 = (void *)0x0;
    }
  }
  return pvVar3;
}

Assistant:

void *allocmem(memory *m, int elemsize)
{
   if (m->current < m->last)
      m->current = (void *) ((char *) (m->current) + elemsize);
   else {
      if (++m->nr >= MAXBLOCKS) return NULL;
      if (m->nr > m->allocnr) {
         m->block[m->nr] = malloc(m->blocksize);
         m->allocnr++;
      }
      m->current = m->first = m->block[m->nr];
      m->last = (void *)
         ((char *) (m->first) + m->blocksize - elemsize);
   }
   return m->current;
}